

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameIdenticalPayoff.cpp
# Opt level: O2

void __thiscall
BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
          (BayesianGameIdenticalPayoff *this,size_t nrAgents,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrActions,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *nrTypes,bool useSparseRewardModel)

{
  size_t sVar1;
  size_t sVar2;
  RewardModelMappingSparseMapped *this_00;
  undefined7 in_register_00000081;
  allocator<char> local_6a;
  allocator<char> local_69;
  string local_68;
  string local_48;
  
  BayesianGameIdenticalPayoffInterface::BayesianGameIdenticalPayoffInterface
            (&this->super_BayesianGameIdenticalPayoffInterface,nrAgents,nrActions,nrTypes);
  (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
  super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
  _vptr_Interface_ProblemToPolicyDiscrete = (_func_int **)&PTR__BayesianGameIdenticalPayoff_005d8168
  ;
  this->_m_utilFunction = (RewardModelDiscreteInterface *)0x0;
  this->_m_initialized = false;
  if ((int)CONCAT71(in_register_00000081,useSparseRewardModel) == 0) {
    this_00 = (RewardModelMappingSparseMapped *)operator_new(0x80);
    sVar1 = (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJTypes;
    sVar2 = (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJA;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"type",&local_69);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"ja",&local_6a);
    RewardModelMapping::RewardModelMapping
              ((RewardModelMapping *)this_00,sVar1,sVar2,&local_48,&local_68);
  }
  else {
    this_00 = (RewardModelMappingSparseMapped *)operator_new(0x98);
    sVar1 = (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJTypes;
    sVar2 = (this->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrJA;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"type",&local_69);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"ja",&local_6a);
    RewardModelMappingSparseMapped::RewardModelMappingSparseMapped
              (this_00,sVar1,sVar2,&local_48,&local_68);
  }
  this->_m_utilFunction = (RewardModelDiscreteInterface *)this_00;
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff(size_t nrAgents, 
                                                         const vector<size_t>& nrActions, 
                                                         const vector<size_t>& nrTypes,
                                                         bool useSparseRewardModel) :
    BayesianGameIdenticalPayoffInterface(nrAgents, nrActions, nrTypes),
    _m_utilFunction(0)
{
    _m_initialized=false;

    if(useSparseRewardModel)
        _m_utilFunction=new RewardModelMappingSparseMapped(_m_nrJTypes, _m_nrJA, "type", "ja");
    else
        _m_utilFunction=new RewardModelMapping(_m_nrJTypes, _m_nrJA, "type", "ja");
}